

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZEqnArray<std::complex<long_double>_>,_10>::Resize
          (TPZManVector<TPZEqnArray<std::complex<long_double>_>,_10> *this,int64_t newsize,
          TPZEqnArray<std::complex<long_double>_> *object)

{
  long lVar1;
  undefined1 auVar2 [16];
  ostream *this_00;
  TPZEqnArray<std::complex<long_double>_> *pTVar3;
  ulong uVar4;
  ulong uVar5;
  void *pvVar6;
  TPZEqnArray<std::complex<long_double>_> *pTVar7;
  long in_RSI;
  TPZManVector<TPZEqnArray<std::complex<long_double>_>,_10> *in_RDI;
  ulong uVar8;
  TPZEqnArray<std::complex<long_double>_> *newstore;
  int64_t realsize;
  int64_t i_2;
  int64_t i_1;
  int64_t i;
  TPZEqnArray<std::complex<long_double>_> *in_stack_ffffffffffffff08;
  TPZEqnArray<std::complex<long_double>_> *in_stack_ffffffffffffff10;
  TPZEqnArray<std::complex<long_double>_> *this_01;
  TPZEqnArray<std::complex<long_double>_> *in_stack_ffffffffffffff40;
  TPZEqnArray<std::complex<long_double>_> *local_a8;
  long local_30;
  long local_28;
  long local_20;
  
  if (in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != (in_RDI->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements) {
    if ((in_RDI->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNAlloc < in_RSI) {
      if (in_RSI < 0xb) {
        for (local_28 = 0;
            local_28 < (in_RDI->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements;
            local_28 = local_28 + 1) {
          TPZEqnArray<std::complex<long_double>_>::operator=
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
        for (; local_28 < in_RSI; local_28 = local_28 + 1) {
          TPZEqnArray<std::complex<long_double>_>::operator=
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
        if (((in_RDI->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fStore !=
             (TPZEqnArray<std::complex<long_double>_> *)&in_RDI->field_0x20) &&
           (pTVar7 = (in_RDI->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fStore,
           pTVar7 != (TPZEqnArray<std::complex<long_double>_> *)0x0)) {
          lVar1 = *(long *)&pTVar7[-1].field_0x9058;
          for (pTVar3 = pTVar7 + lVar1; pTVar7 != pTVar3; pTVar3 = pTVar3 + -1) {
            TPZEqnArray<std::complex<long_double>_>::~TPZEqnArray(in_stack_ffffffffffffff10);
          }
          operator_delete__(&pTVar7[-1].fLastTerm,lVar1 * 0x9060 + 0x10);
        }
        (in_RDI->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fStore =
             (TPZEqnArray<std::complex<long_double>_> *)&in_RDI->field_0x20;
        (in_RDI->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNAlloc = 10;
      }
      else {
        uVar4 = ExpandSize(in_RDI,in_RSI);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar4;
        uVar5 = SUB168(auVar2 * ZEXT816(0x9060),0);
        uVar8 = uVar5 + 0x10;
        if (SUB168(auVar2 * ZEXT816(0x9060),8) != 0 || 0xffffffffffffffef < uVar5) {
          uVar8 = 0xffffffffffffffff;
        }
        pvVar6 = operator_new__(uVar8);
        *(ulong *)((long)pvVar6 + 8) = uVar4;
        pTVar7 = (TPZEqnArray<std::complex<long_double>_> *)((long)pvVar6 + 0x10);
        if (uVar4 != 0) {
          local_a8 = pTVar7;
          do {
            TPZEqnArray<std::complex<long_double>_>::TPZEqnArray(in_stack_ffffffffffffff40);
            local_a8 = local_a8 + 1;
          } while (local_a8 != pTVar7 + uVar4);
        }
        for (local_30 = 0;
            local_30 < (in_RDI->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements;
            local_30 = local_30 + 1) {
          TPZEqnArray<std::complex<long_double>_>::operator=
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
        for (; local_30 < in_RSI; local_30 = local_30 + 1) {
          TPZEqnArray<std::complex<long_double>_>::operator=
                    (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
        if (((in_RDI->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fStore !=
             (TPZEqnArray<std::complex<long_double>_> *)&in_RDI->field_0x20) &&
           (pTVar3 = (in_RDI->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fStore,
           pTVar3 != (TPZEqnArray<std::complex<long_double>_> *)0x0)) {
          lVar1 = *(long *)&pTVar3[-1].field_0x9058;
          this_01 = pTVar3 + lVar1;
          while (pTVar3 != this_01) {
            this_01 = this_01 + -1;
            TPZEqnArray<std::complex<long_double>_>::~TPZEqnArray(this_01);
          }
          operator_delete__(&pTVar3[-1].fLastTerm,lVar1 * 0x9060 + 0x10);
        }
        (in_RDI->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fStore = pTVar7;
        (in_RDI->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNAlloc = uVar4;
      }
    }
    else {
      for (local_20 = (in_RDI->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements;
          local_20 < in_RSI; local_20 = local_20 + 1) {
        TPZEqnArray<std::complex<long_double>_>::operator=
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      }
      (in_RDI->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}